

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ResolveSelfReference(Parse *pParse,Table *pTab,int type,Expr *pExpr,ExprList *pList)

{
  int iVar1;
  int iVar2;
  SrcList sSrc;
  SrcList local_b8;
  NameContext local_40;
  
  local_40.pSrcList = &local_b8;
  local_40.pWinSelect = (Select *)0x0;
  local_40.nRef = 0;
  local_40.nErr = 0;
  local_40.uNC.pEList = (ExprList *)0x0;
  local_40.pNext = (NameContext *)0x0;
  local_b8.a[0].pSchema = (Schema *)0x0;
  local_b8.a[0].zDatabase = (char *)0x0;
  local_b8.a[0].zName = (char *)0x0;
  local_b8.a[0].zAlias = (char *)0x0;
  local_b8.a[0].pTab = (Table *)0x0;
  local_b8.a[0].pSelect = (Select *)0x0;
  local_b8.a[0].addrFillSub = 0;
  local_b8.a[0].regReturn = 0;
  local_b8.a[0].regResult = 0;
  local_b8.a[0].fg = (anon_struct_4_7_7ffbf296_for_fg)0x0;
  local_b8.a[0].iCursor = 0;
  local_b8.a[0]._68_4_ = 0;
  local_b8.a[0].pOn = (Expr *)0x0;
  local_b8.a[0].pUsing = (IdList *)0x0;
  local_b8.a[0].colUsed = 0;
  local_b8.a[0].u1.zIndexedBy = (char *)0x0;
  local_b8.a[0].pIBIndex = (Index *)0x0;
  if (pTab != (Table *)0x0) {
    local_b8.a[0].zName = pTab->zName;
    local_b8.a[0].iCursor = -1;
    local_b8.a[0]._68_4_ = 0;
    local_b8.a[0].pTab = pTab;
  }
  local_b8._1_7_ = 0;
  local_b8.nSrc._0_1_ = pTab != (Table *)0x0;
  local_40._42_6_ = 0;
  local_40.ncFlags = (ushort)type;
  local_40.pParse = pParse;
  iVar1 = sqlite3ResolveExprNames(&local_40,pExpr);
  iVar2 = CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != 0);
  if (pList != (ExprList *)0x0 && iVar1 == 0) {
    iVar2 = sqlite3ResolveExprListNames(&local_40,pList);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveSelfReference(
  Parse *pParse,      /* Parsing context */
  Table *pTab,        /* The table being referenced, or NULL */
  int type,           /* NC_IsCheck or NC_PartIdx or NC_IdxExpr, or 0 */
  Expr *pExpr,        /* Expression to resolve.  May be NULL. */
  ExprList *pList     /* Expression list to resolve.  May be NULL. */
){
  SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
  NameContext sNC;                /* Name context for pParse->pNewTable */
  int rc;

  assert( type==0 || pTab!=0 );
  assert( type==NC_IsCheck || type==NC_PartIdx || type==NC_IdxExpr || pTab==0 );
  memset(&sNC, 0, sizeof(sNC));
  memset(&sSrc, 0, sizeof(sSrc));
  if( pTab ){
    sSrc.nSrc = 1;
    sSrc.a[0].zName = pTab->zName;
    sSrc.a[0].pTab = pTab;
    sSrc.a[0].iCursor = -1;
  }
  sNC.pParse = pParse;
  sNC.pSrcList = &sSrc;
  sNC.ncFlags = type;
  if( (rc = sqlite3ResolveExprNames(&sNC, pExpr))!=SQLITE_OK ) return rc;
  if( pList ) rc = sqlite3ResolveExprListNames(&sNC, pList);
  return rc;
}